

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

bool ON_WildCardMatchNoCase(char *s,char *pattern)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  
LAB_005c15fe:
  if ((pattern == (char *)0x0) || (*pattern == '\0')) {
    if (s == (char *)0x0) {
LAB_005c16b0:
      bVar3 = true;
    }
    else {
      bVar3 = *s == '\0';
    }
  }
  else {
    if (*pattern != '*') {
      do {
        cVar2 = *pattern;
        if (cVar2 == '?') {
          if (*s == '\0') goto LAB_005c169f;
        }
        else {
          if (cVar2 == '\\') {
            if ((pattern[1] == '?') || (pattern[1] == '*')) {
              pattern = pattern + 1;
            }
          }
          else if (cVar2 == '*') goto LAB_005c15fe;
          iVar4 = toupper((int)*pattern);
          cVar2 = *s;
          iVar5 = toupper((int)cVar2);
          if (iVar4 != iVar5) goto LAB_005c169f;
          if (cVar2 == '\0') goto LAB_005c16b0;
        }
        pattern = pattern + 1;
        s = s + 1;
      } while( true );
    }
    do {
      pcVar1 = pattern + 1;
      pattern = pattern + 1;
    } while (*pcVar1 == '*');
    if (*pcVar1 == '\0') goto LAB_005c16b0;
    if (*s == '\0') {
LAB_005c169f:
      bVar3 = false;
    }
    else {
      while (bVar3 = ON_WildCardMatchNoCase(s,pattern), !bVar3) {
        pcVar1 = s + 1;
        s = s + 1;
        if (*pcVar1 == '\0') {
          return bVar3;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool ON_WildCardMatchNoCase(const char* s, const char* pattern)
{
  if ( !pattern || !pattern[0] ) {
    return ( !s || !s[0] ) ? true : false;
  }

  if ( *pattern == '*' ) 
  {
    pattern++;
    while ( *pattern == '*' )
      pattern++;
    
    if ( !pattern[0] )
      return true;

    while (*s) {
      if ( ON_WildCardMatchNoCase(s,pattern) )
        return true;
      s++;
    }

    return false;
  }

  while ( *pattern != '*' )
  {
    if ( *pattern == '?' ) {
      if ( *s) {
        pattern++;
        s++;
        continue;
      }
      return false;
    }
    
    if ( *pattern == '\\' ) {
      switch( pattern[1] )
      {
      case '*':
      case '?':
        pattern++;
        break;
      }
    }
    if ( toupper(*pattern) != toupper(*s) ) {
      return false;
    }

    if ( *s == 0 )
      return true;

    pattern++;
    s++;
  }
  
  return ON_WildCardMatchNoCase(s,pattern);
}